

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkDuplicateIfConditions(CheckerVisitor *this,IfStatement *ifStmt)

{
  bool bVar1;
  IfStatement *elseNode;
  Expr *duplicated;
  
  if (this->effectsOnly == false) {
    elseNode = (IfStatement *)unwrapSingleBlock(ifStmt->_elseB);
    duplicated = (Expr *)0x0;
    if (((elseNode != (IfStatement *)0x0) && ((elseNode->super_Statement).super_Node._op == TO_IF))
       && (bVar1 = findIfWithTheSameCondition(this,ifStmt->_cond,elseNode,&duplicated), bVar1)) {
      report(this,&duplicated->super_Node,0x43);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkDuplicateIfConditions(IfStatement *ifStmt) {

  if (effectsOnly)
    return;

  const Statement *elseB = unwrapSingleBlock(ifStmt->elseBranch());
  const Expr *duplicated = nullptr;

  if (elseB && elseB->op() == TO_IF) {
    if (findIfWithTheSameCondition(ifStmt->condition(), static_cast<const IfStatement *>(elseB), duplicated)) {
      // TODO: high-light both conditions, original and duplicated
      report(duplicated, DiagnosticsId::DI_DUPLICATE_IF_EXPR);
    }
  }
}